

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_net_methods.cpp
# Opt level: O3

void Marshall_object_proc(int the_socket,Am_Value *in_value,Am_Connection *my_connection_ptr)

{
  bool bVar1;
  unsigned_short uVar2;
  int iVar3;
  char *pcVar4;
  Am_Value *pAVar5;
  anon_union_8_8_ea4c8939_for_value aVar6;
  Am_Object in_obj;
  Am_String proto_name;
  char proto_name_1 [30];
  long inst_num;
  Am_Object AStack_98;
  Am_String local_90;
  Am_Value local_88;
  Am_Value_List local_78 [2];
  Am_Value local_50;
  Am_Value local_40;
  anon_union_8_8_ea4c8939_for_value local_30;
  
  Am_Object::Am_Object(&AStack_98,in_value);
  pcVar4 = Am_Connection::Get_Net_Proto_Name(&AStack_98);
  Am_String::Am_String(&local_90,pcVar4,true);
  Am_Value::Am_Value(&local_88,&local_90);
  Am_Connection::Send(my_connection_ptr,&local_88);
  Am_Value::~Am_Value(&local_88);
  pcVar4 = Am_Connection::Get_Net_Object_ID(&AStack_98);
  if (pcVar4 == (char *)0x0) {
    uVar2 = Am_Value_List::Length(&Am_Connection::Net_Instances);
    pcVar4 = Am_String::operator_cast_to_char_(&local_90);
    aVar6._0_4_ = uVar2 + 1;
    aVar6.long_value._4_4_ = 0;
    Am_Connection::Set_Net_Instance(&AStack_98,pcVar4,aVar6._0_4_);
  }
  else {
    __isoc99_sscanf(pcVar4,"%s %ld",local_78,&local_30);
    aVar6 = local_30;
  }
  local_50.type = 3;
  local_50.value = aVar6;
  Am_Connection::Send(my_connection_ptr,&local_50);
  Am_Value::~Am_Value(&local_50);
  pAVar5 = Am_Object::Get(&AStack_98,0xb8,0);
  Am_Value_List::Am_Value_List(local_78,pAVar5);
  Am_Value_List::Start(local_78);
  while( true ) {
    bVar1 = Am_Value_List::Last(local_78);
    if (bVar1) break;
    pAVar5 = Am_Value_List::Get(local_78);
    iVar3 = Am_Value::operator_cast_to_int(pAVar5);
    pAVar5 = Am_Object::Get(&AStack_98,(Am_Slot_Key)iVar3,0);
    Am_Value::Am_Value(&local_40,pAVar5);
    Am_Connection::Send(my_connection_ptr,&local_40);
    Am_Value::~Am_Value(&local_40);
    Am_Value_List::Next(local_78);
  }
  Am_Value_List::~Am_Value_List(local_78);
  Am_String::~Am_String(&local_90);
  Am_Object::~Am_Object(&AStack_98);
  return;
}

Assistant:

Am_Define_Method(Am_Marshall_Method, void, Marshall_object,
                 (int the_socket, const Am_Value &in_value,
                  Am_Connection *my_connection_ptr))
{
  (void)the_socket; // avoid warning
  Am_Object in_obj = in_value;
  Am_String proto_name = Am_Connection::Get_Net_Proto_Name(in_obj);
  //
  my_connection_ptr->Send(proto_name);

  //
  const char *in_obj_id = Am_Connection::Get_Net_Object_ID(in_obj);
  //
  long instance_num;
  if (in_obj_id == nullptr) // No ID assigned yet
  {
    //
    instance_num = Am_Connection::Num_Instances() + 1;
    Am_Connection::Set_Net_Instance(in_obj, proto_name, instance_num);
  } else {
    instance_num = my_connection_ptr->Extract_Instance_Num(in_obj_id);
  }
  my_connection_ptr->Send(instance_num);
  //  recv(the_socket, &net_type,sizeof(net_type),0);
  //  bool ok=Unmarshall_bool.Call(the_socket,my_connection_ptr);
  if (true) {
    Am_Value_List slot_list = in_obj.Get(Am_SLOTS_TO_SAVE);
    Am_Slot_Key current_slot;
    for (
        slot_list.Start(); !(slot_list.Last());
        slot_list
            .Next()) { /*Note: slot keys are shorts, value is char 256 will overflow!*/
      current_slot = (int)slot_list.Get();
      my_connection_ptr->Send(in_obj.Get(current_slot));
    }
  } else // Not ok
    std::cerr << " Error when sending object: " << in_obj << "!\n";
}